

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O3

bool __thiscall Rml::FontEffectOutline::Initialise(FontEffectOutline *this,int _width)

{
  int iVar1;
  bool bVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  
  if (0 < _width) {
    this->width = _width;
    ConvolutionFilter::Initialise(&this->filter,_width,Dilation);
    uVar4 = this->width;
    uVar6 = (ulong)uVar4;
    if (-1 < (int)uVar4) {
      iVar7 = -uVar4;
      do {
        uVar4 = (uint)uVar6;
        if (-1 < (int)uVar4) {
          uVar5 = ~uVar4;
          lVar8 = (long)(int)-uVar4;
          do {
            fVar9 = Math::SquareRoot((float)((int)lVar8 * (int)lVar8 + iVar7 * iVar7));
            iVar1 = this->width;
            fVar10 = 1.0;
            if (((float)iVar1 < fVar9) && (fVar10 = (float)(iVar1 + 1) - fVar9, fVar10 <= 0.0)) {
              fVar10 = 0.0;
            }
            pfVar3 = ConvolutionFilter::operator[](&this->filter,iVar1 + iVar7);
            iVar1 = this->width;
            uVar6 = (ulong)iVar1;
            pfVar3[uVar6 + lVar8] = fVar10;
            uVar5 = uVar5 + 1;
            lVar8 = lVar8 + 1;
          } while ((int)uVar5 < iVar1);
        }
        bVar2 = iVar7 < (int)uVar6;
        iVar7 = iVar7 + 1;
      } while (bVar2);
    }
  }
  return 0 < _width;
}

Assistant:

bool FontEffectOutline::Initialise(int _width)
{
	if (_width <= 0)
		return false;

	width = _width;

	filter.Initialise(width, FilterOperation::Dilation);
	for (int x = -width; x <= width; ++x)
	{
		for (int y = -width; y <= width; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width)
			{
				weight = (width + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter[x + width][y + width] = weight;
		}
	}

	return true;
}